

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O3

void distfleeck(monst *mtmp,int *inrange,int *nearby,int *scared)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  you *pyVar5;
  xchar *pxVar6;
  
  iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy);
  uVar3 = 0;
  *inrange = (uint)(iVar2 < 0x41);
  if (iVar2 < 0x41) {
    bVar1 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
    uVar3 = (uint)(bVar1 != '\0');
  }
  pyVar5 = (you *)&mtmp->mux;
  pxVar6 = &mtmp->muy;
  *nearby = uVar3;
  if (((mtmp->field_0x62 & 2) != 0) &&
     ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
        (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
       (u.uprops[0xd].blocked != 0)) || ((mtmp->data->mflags1 & 0x1000000) != 0)))) {
    pxVar6 = &u.uy;
    pyVar5 = &u;
  }
  if (uVar3 == 0) {
LAB_001f1074:
    *scared = 0;
    return;
  }
  bVar1 = onscary((int)pyVar5->ux,(int)*pxVar6,mtmp);
  if (bVar1 == '\0') {
    if (((mtmp->field_0x62 & 0x40) != 0) ||
       (bVar1 = in_your_sanctuary(mtmp,'\0','\0'), bVar1 == '\0')) goto LAB_001f1074;
    bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level);
    *scared = (uint)(bVar1 == '\0');
    if (bVar1 != '\0') {
      return;
    }
  }
  else {
    *scared = 1;
  }
  uVar3 = mt_random();
  uVar4 = mt_random();
  if (uVar3 * -0x49249249 < 0x24924925) {
    iVar2 = (uVar4 / 100) * 100;
  }
  else {
    iVar2 = (uVar4 / 10) * 10;
  }
  monflee(mtmp,(uVar4 - iVar2) + 1,'\x01','\x01');
  return;
}

Assistant:

static void distfleeck(struct monst *mtmp, int *inrange, int *nearby, int *scared)
{
	int seescaryx, seescaryy;

	*inrange = (dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <=
							(BOLT_LIM * BOLT_LIM));
	*nearby = *inrange && monnear(mtmp, mtmp->mux, mtmp->muy);

	/* Note: if your image is displaced, the monster sees the Elbereth
	 * at your displaced position, thus never attacking your displaced
	 * position, but possibly attacking you by accident.  If you are
	 * invisible, it sees the Elbereth at your real position, thus never
	 * running into you by accident but possibly attacking the spot
	 * where it guesses you are.
	 */
	if (!mtmp->mcansee || (Invis && !perceives(mtmp->data))) {
		seescaryx = mtmp->mux;
		seescaryy = mtmp->muy;
	} else {
		seescaryx = u.ux;
		seescaryy = u.uy;
	}
	*scared = (*nearby && (onscary(seescaryx, seescaryy, mtmp) ||
			       (!mtmp->mpeaceful &&
				in_your_sanctuary(mtmp, 0, 0) &&
				/* don't warn due to fleeing monsters about
				 * the right temple on Astral */
				!Is_astralevel(&u.uz))));

	if (*scared) {
		if (rn2(7))
		    monflee(mtmp, rnd(10), TRUE, TRUE);
		else
		    monflee(mtmp, rnd(100), TRUE, TRUE);
	}

}